

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O0

void __thiscall nn::ESoinn::SealNeuronVector(ESoinn *this)

{
  ConcreteLogger *this_00;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  uint local_84;
  uint32_t i_1;
  runtime_error anon_var_0;
  uint local_6c;
  uint local_68;
  uint32_t j;
  uint32_t i;
  uint32_t count_notnull;
  vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> newNeurons;
  allocator local_31;
  string local_30;
  ESoinn *local_10;
  ESoinn *this_local;
  
  this_00 = log_netw;
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"SealNeuronVector function",&local_31);
  logger::ConcreteLogger::debug(this_00,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::vector
            ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)&i);
  j = 0;
  for (local_68 = 0;
      sVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), local_68 < sVar2; local_68 = local_68 + 1) {
    pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)local_68);
    bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar3);
    if (!bVar1) {
      if (local_68 == j) {
        j = j + 1;
      }
      else {
        for (local_6c = 0;
            sVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                              (&this->m_Neurons), local_6c < sVar2; local_6c = local_6c + 1) {
          pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                   operator[](&this->m_Neurons,(ulong)local_6c);
          bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar3);
          if (!bVar1) {
            pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::
                     operator[](&this->m_Neurons,(ulong)local_6c);
            neuron::ESoinnNeuron::replaceNeighbour(pvVar3,local_68,j,true);
          }
        }
        j = j + 1;
      }
    }
  }
  for (local_84 = 0;
      sVar2 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::size
                        (&this->m_Neurons), local_84 < sVar2; local_84 = local_84 + 1) {
    pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                       (&this->m_Neurons,(ulong)local_84);
    bVar1 = neuron::ESoinnNeuron::is_deleted(pvVar3);
    if (!bVar1) {
      pvVar3 = std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator[]
                         (&this->m_Neurons,(ulong)local_84);
      std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::push_back
                ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)&i,pvVar3);
    }
  }
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator=
            (&this->m_Neurons,
             (vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)&i);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::~vector
            ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)&i);
  return;
}

Assistant:

void ESoinn::SealNeuronVector()
    {
        log_netw->debug("SealNeuronVector function");
        std::vector<neuron::ESoinnNeuron> newNeurons;
        uint32_t count_notnull = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            if (i == count_notnull)
            {
                count_notnull++;
                continue;
            }
            //newNeurons.push_back(m_Neurons[i]);
            for (uint32_t j = 0; j < m_Neurons.size(); j++)
            {
                if (m_Neurons[j].is_deleted())
                    continue;
                try
                {
                    m_Neurons[j].replaceNeighbour(i, count_notnull, true);    
                }
                catch (std::runtime_error)
                {
                }
            }
            count_notnull++;    
        }
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            newNeurons.push_back(m_Neurons[i]);
        }
        m_Neurons = newNeurons;        
    }